

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  long lVar6;
  long lVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined1 auVar10 [16];
  undefined4 uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  size_t itime;
  int iVar17;
  float fVar18;
  undefined1 auVar20 [16];
  float fVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar30;
  undefined1 auVar29 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  float fVar37;
  float fVar38;
  undefined1 auVar36 [16];
  float fVar39;
  float fVar41;
  float fVar42;
  undefined1 auVar40 [16];
  float fVar43;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_1f0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  size_t local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  ulong local_120;
  anon_class_16_2_07cfa4d6 local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  local_178._8_4_ = 0x7f800000;
  local_178._0_8_ = 0x7f8000007f800000;
  local_178._12_4_ = 0x7f800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  local_188._8_4_ = 0xff800000;
  local_188._0_8_ = 0xff800000ff800000;
  local_188._12_4_ = 0xff800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar20._8_8_ = 0;
  auVar20._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar20._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar23._8_8_ = 0;
  auVar23._0_4_ = time_range->lower;
  auVar23._4_4_ = time_range->upper;
  auVar21 = vcmpps_avx(auVar20,auVar23,1);
  auVar24 = vinsertps_avx(auVar23,auVar20,0x50);
  auVar20 = vinsertps_avx(auVar20,auVar23,0x50);
  local_b8 = vblendvps_avx(auVar20,auVar24,auVar21);
  auVar31 = ZEXT1664(local_b8);
  local_c8 = vmovshdup_avx(local_b8);
  auVar32 = ZEXT1664(local_c8);
  if (local_b8._0_4_ <= local_c8._0_4_) {
    uVar13 = r->_begin;
    if (uVar13 < r->_end) {
      local_1f0 = 0;
      auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar34 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      auVar35 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      local_1a8._8_4_ = 0x7f800000;
      local_1a8._0_8_ = 0x7f8000007f800000;
      local_1a8._12_4_ = 0x7f800000;
      local_178._8_4_ = 0x7f800000;
      local_178._0_8_ = 0x7f8000007f800000;
      local_178._12_4_ = 0x7f800000;
      local_198._8_4_ = 0xff800000;
      local_198._0_8_ = 0xff800000ff800000;
      local_198._12_4_ = 0xff800000;
      local_188._8_4_ = 0xff800000;
      local_188._0_8_ = 0xff800000ff800000;
      local_188._12_4_ = 0xff800000;
      local_1b0 = k;
      do {
        BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar21._8_8_ = 0;
        auVar21._0_4_ = BVar2.lower;
        auVar21._4_4_ = BVar2.upper;
        auVar21 = vmovshdup_avx(auVar21);
        fVar18 = BVar2.lower;
        fVar25 = auVar31._0_4_ - fVar18;
        fVar30 = auVar21._0_4_ - fVar18;
        uVar3 = *(uint *)(*(long *)&(this->
                                    super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>
                                   ).super_CurveGeometry.field_0x68 * uVar13);
        uVar12 = (ulong)(uVar3 + 1);
        pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.vertices.items;
        if (uVar12 < (pBVar4->super_RawBufferView).num) {
          fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                  super_CurveGeometry.super_Geometry.fnumTimeSegments;
          auVar24 = ZEXT416((uint)(fVar1 * (fVar25 / fVar30) * 1.0000002));
          auVar24 = vroundss_avx(auVar24,auVar24,9);
          auVar24 = vmaxss_avx(auVar33._0_16_,auVar24);
          auVar20 = ZEXT416((uint)(fVar1 * ((auVar32._0_4_ - fVar18) / fVar30) * 0.99999976));
          auVar20 = vroundss_avx(auVar20,auVar20,10);
          auVar20 = vminss_avx(auVar20,ZEXT416((uint)fVar1));
          if ((uint)(int)auVar24._0_4_ <= (uint)(int)auVar20._0_4_) {
            uVar15 = (ulong)(int)auVar24._0_4_;
            pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.tangents.items;
            lVar16 = uVar15 * 0x38 + 0x10;
            do {
              lVar6 = *(long *)((long)pBVar4 + lVar16 + -0x10);
              lVar7 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar16);
              auVar24 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar3);
              auVar27 = auVar34._0_16_;
              auVar23 = vcmpps_avx(auVar24,auVar27,2);
              auVar29 = auVar35._0_16_;
              auVar24 = vcmpps_avx(auVar24,auVar29,5);
              auVar24 = vorps_avx(auVar23,auVar24);
              if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar24[0xf] < '\0') goto LAB_01224d83;
              auVar24 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar12);
              auVar23 = vcmpps_avx(auVar24,auVar27,2);
              auVar24 = vcmpps_avx(auVar24,auVar29,5);
              auVar24 = vorps_avx(auVar23,auVar24);
              if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar24[0xf] < '\0') goto LAB_01224d83;
              lVar6 = *(long *)((long)pBVar5 + lVar16 + -0x10);
              lVar7 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar16);
              auVar24 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar3);
              auVar23 = vcmpps_avx(auVar24,auVar27,2);
              auVar24 = vcmpps_avx(auVar24,auVar29,5);
              auVar24 = vorps_avx(auVar23,auVar24);
              if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar24[0xf] < '\0') goto LAB_01224d83;
              auVar24 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar12);
              auVar23 = vcmpps_avx(auVar24,auVar27,2);
              auVar24 = vcmpps_avx(auVar24,auVar29,5);
              auVar24 = vorps_avx(auVar23,auVar24);
              if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar24[0xf] < '\0') goto LAB_01224d83;
              uVar15 = uVar15 + 1;
              lVar16 = lVar16 + 0x38;
            } while (uVar15 <= (ulong)(long)(int)auVar20._0_4_);
          }
          fVar19 = auVar21._0_4_ - fVar18;
          fVar25 = fVar25 / fVar19;
          fVar19 = (auVar32._0_4_ - fVar18) / fVar19;
          fVar30 = fVar1 * fVar25;
          fVar18 = fVar1 * fVar19;
          auVar20 = vroundss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),9);
          auVar23 = vroundss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),10);
          auVar21 = vmaxss_avx(auVar20,auVar33._0_16_);
          auVar24 = vminss_avx(auVar23,ZEXT416((uint)fVar1));
          iVar14 = (int)auVar21._0_4_;
          fVar26 = auVar24._0_4_;
          local_118.primID = &local_120;
          uVar3 = (int)auVar20._0_4_;
          if ((int)auVar20._0_4_ < 0) {
            uVar3 = 0xffffffff;
          }
          iVar17 = (int)fVar1 + 1;
          if ((int)auVar23._0_4_ < (int)fVar1 + 1) {
            iVar17 = (int)auVar23._0_4_;
          }
          local_120 = uVar13;
          local_118.this =
               (CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
                *)this;
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_e8.field_1,&local_118,(long)iVar14);
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_108.field_1,&local_118,(long)(int)fVar26);
          fVar30 = fVar30 - auVar21._0_4_;
          if (iVar17 - uVar3 == 1) {
            auVar21 = ZEXT816(0) << 0x40;
            auVar24 = vmaxss_avx(ZEXT416((uint)fVar30),auVar21);
            auVar20 = vshufps_avx(auVar24,auVar24,0);
            auVar24 = ZEXT416((uint)(1.0 - auVar24._0_4_));
            auVar24 = vshufps_avx(auVar24,auVar24,0);
            auVar36._0_4_ = auVar20._0_4_ * local_108.m128[0] + auVar24._0_4_ * local_e8.m128[0];
            auVar36._4_4_ = auVar20._4_4_ * local_108.m128[1] + auVar24._4_4_ * local_e8.m128[1];
            auVar36._8_4_ = auVar20._8_4_ * local_108.m128[2] + auVar24._8_4_ * local_e8.m128[2];
            auVar36._12_4_ = auVar20._12_4_ * local_108.m128[3] + auVar24._12_4_ * local_e8.m128[3];
            auVar40._0_4_ = auVar20._0_4_ * local_f8 + auVar24._0_4_ * local_d8;
            auVar40._4_4_ = auVar20._4_4_ * fStack_f4 + auVar24._4_4_ * fStack_d4;
            auVar40._8_4_ = auVar20._8_4_ * fStack_f0 + auVar24._8_4_ * fStack_d0;
            auVar40._12_4_ = auVar20._12_4_ * fStack_ec + auVar24._12_4_ * fStack_cc;
            auVar24 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar18)),auVar21);
            auVar20 = vshufps_avx(auVar24,auVar24,0);
            auVar24 = ZEXT416((uint)(1.0 - auVar24._0_4_));
            auVar24 = vshufps_avx(auVar24,auVar24,0);
            auVar27._0_4_ = auVar24._0_4_ * local_108.m128[0] + auVar20._0_4_ * local_e8.m128[0];
            auVar27._4_4_ = auVar24._4_4_ * local_108.m128[1] + auVar20._4_4_ * local_e8.m128[1];
            auVar27._8_4_ = auVar24._8_4_ * local_108.m128[2] + auVar20._8_4_ * local_e8.m128[2];
            auVar27._12_4_ = auVar24._12_4_ * local_108.m128[3] + auVar20._12_4_ * local_e8.m128[3];
            auVar29._0_4_ = auVar24._0_4_ * local_f8 + auVar20._0_4_ * local_d8;
            auVar29._4_4_ = auVar24._4_4_ * fStack_f4 + auVar20._4_4_ * fStack_d4;
            auVar29._8_4_ = auVar24._8_4_ * fStack_f0 + auVar20._8_4_ * fStack_d0;
            auVar29._12_4_ = auVar24._12_4_ * fStack_ec + auVar20._12_4_ * fStack_cc;
          }
          else {
            ::anon_func::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_118,(long)(iVar14 + 1));
            ::anon_func::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_118,(long)((int)fVar26 + -1));
            auVar21 = vmaxss_avx(ZEXT416((uint)fVar30),ZEXT816(0) << 0x40);
            auVar24 = vshufps_avx(auVar21,auVar21,0);
            auVar21 = ZEXT416((uint)(1.0 - auVar21._0_4_));
            auVar21 = vshufps_avx(auVar21,auVar21,0);
            auVar36._0_4_ = auVar24._0_4_ * local_58.m128[0] + auVar21._0_4_ * local_e8.m128[0];
            auVar36._4_4_ = auVar24._4_4_ * local_58.m128[1] + auVar21._4_4_ * local_e8.m128[1];
            auVar36._8_4_ = auVar24._8_4_ * local_58.m128[2] + auVar21._8_4_ * local_e8.m128[2];
            auVar36._12_4_ = auVar24._12_4_ * local_58.m128[3] + auVar21._12_4_ * local_e8.m128[3];
            auVar40._0_4_ = auVar24._0_4_ * local_48 + auVar21._0_4_ * local_d8;
            auVar40._4_4_ = auVar24._4_4_ * fStack_44 + auVar21._4_4_ * fStack_d4;
            auVar40._8_4_ = auVar24._8_4_ * fStack_40 + auVar21._8_4_ * fStack_d0;
            auVar40._12_4_ = auVar24._12_4_ * fStack_3c + auVar21._12_4_ * fStack_cc;
            auVar21 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar18)),ZEXT816(0) << 0x40);
            auVar24 = vshufps_avx(auVar21,auVar21,0);
            auVar21 = ZEXT416((uint)(1.0 - auVar21._0_4_));
            auVar21 = vshufps_avx(auVar21,auVar21,0);
            auVar27._0_4_ = auVar24._0_4_ * local_78.m128[0] + auVar21._0_4_ * local_108.m128[0];
            auVar27._4_4_ = auVar24._4_4_ * local_78.m128[1] + auVar21._4_4_ * local_108.m128[1];
            auVar27._8_4_ = auVar24._8_4_ * local_78.m128[2] + auVar21._8_4_ * local_108.m128[2];
            auVar27._12_4_ = auVar24._12_4_ * local_78.m128[3] + auVar21._12_4_ * local_108.m128[3];
            auVar29._0_4_ = auVar24._0_4_ * local_68 + auVar21._0_4_ * local_f8;
            auVar29._4_4_ = auVar24._4_4_ * fStack_64 + auVar21._4_4_ * fStack_f4;
            auVar29._8_4_ = auVar24._8_4_ * fStack_60 + auVar21._8_4_ * fStack_f0;
            auVar29._12_4_ = auVar24._12_4_ * fStack_5c + auVar21._12_4_ * fStack_ec;
            if ((int)(uVar3 + 1) < iVar17) {
              itime = (size_t)(uVar3 + 1);
              iVar17 = ~uVar3 + iVar17;
              do {
                auVar22._0_4_ = ((float)(int)itime / fVar1 - fVar25) / (fVar19 - fVar25);
                auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar21 = vshufps_avx(auVar22,auVar22,0);
                local_1c8 = auVar27._0_4_;
                fStack_1c4 = auVar27._4_4_;
                fStack_1c0 = auVar27._8_4_;
                fStack_1bc = auVar27._12_4_;
                auVar24 = vshufps_avx(ZEXT416((uint)(1.0 - auVar22._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar22._0_4_)),0);
                fVar37 = auVar36._4_4_;
                fVar38 = auVar36._8_4_;
                fVar39 = auVar36._12_4_;
                fVar30 = auVar29._4_4_;
                fVar18 = auVar29._8_4_;
                fVar26 = auVar29._12_4_;
                fVar41 = auVar40._4_4_;
                fVar42 = auVar40._8_4_;
                fVar43 = auVar40._12_4_;
                local_a8 = auVar29._0_4_ * auVar21._0_4_ + auVar40._0_4_ * auVar24._0_4_;
                fStack_a4 = fVar30 * auVar21._4_4_ + fVar41 * auVar24._4_4_;
                fStack_a0 = fVar18 * auVar21._8_4_ + fVar42 * auVar24._8_4_;
                fStack_9c = fVar26 * auVar21._12_4_ + fVar43 * auVar24._12_4_;
                ::anon_func::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_118,itime);
                auVar10._4_4_ = auVar21._4_4_ * fStack_1c4 + fVar37 * auVar24._4_4_;
                auVar10._0_4_ = auVar21._0_4_ * local_1c8 + auVar36._0_4_ * auVar24._0_4_;
                auVar10._8_4_ = auVar21._8_4_ * fStack_1c0 + fVar38 * auVar24._8_4_;
                auVar10._12_4_ = auVar21._12_4_ * fStack_1bc + fVar39 * auVar24._12_4_;
                auVar21 = vsubps_avx((undefined1  [16])local_98,auVar10);
                auVar24._4_4_ = fStack_a4;
                auVar24._0_4_ = local_a8;
                auVar24._8_4_ = fStack_a0;
                auVar24._12_4_ = fStack_9c;
                auVar20 = vsubps_avx(local_88,auVar24);
                auVar24 = vminps_avx(auVar21,ZEXT816(0) << 0x40);
                auVar21 = vmaxps_avx(auVar20,ZEXT816(0) << 0x40);
                auVar36._0_4_ = auVar36._0_4_ + auVar24._0_4_;
                auVar36._4_4_ = fVar37 + auVar24._4_4_;
                auVar36._8_4_ = fVar38 + auVar24._8_4_;
                auVar36._12_4_ = fVar39 + auVar24._12_4_;
                auVar27._0_4_ = local_1c8 + auVar24._0_4_;
                auVar27._4_4_ = fStack_1c4 + auVar24._4_4_;
                auVar27._8_4_ = fStack_1c0 + auVar24._8_4_;
                auVar27._12_4_ = fStack_1bc + auVar24._12_4_;
                auVar40._0_4_ = auVar40._0_4_ + auVar21._0_4_;
                auVar40._4_4_ = fVar41 + auVar21._4_4_;
                auVar40._8_4_ = fVar42 + auVar21._8_4_;
                auVar40._12_4_ = fVar43 + auVar21._12_4_;
                auVar29._0_4_ = auVar29._0_4_ + auVar21._0_4_;
                auVar29._4_4_ = fVar30 + auVar21._4_4_;
                auVar29._8_4_ = fVar18 + auVar21._8_4_;
                auVar29._12_4_ = fVar26 + auVar21._12_4_;
                itime = itime + 1;
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
            }
            auVar21 = ZEXT816(0) << 0x40;
          }
          auVar33 = ZEXT1664(auVar21);
          auVar21 = vcmpps_avx(auVar36,auVar40,2);
          uVar11 = vmovmskps_avx(auVar21);
          auVar31 = ZEXT1664(local_b8);
          auVar32 = ZEXT1664(local_c8);
          auVar34 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar35 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          if ((~(byte)uVar11 & 7) == 0) {
            auVar21 = vcmpps_avx(auVar27,auVar29,2);
            uVar11 = vmovmskps_avx(auVar21);
            if ((~(byte)uVar11 & 7) == 0) {
              auVar21 = vminps_avx(auVar36,auVar27);
              aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar21,ZEXT416(geomID),0x30);
              auVar21 = vmaxps_avx(auVar40,auVar29);
              aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar21,ZEXT416((uint)uVar13),0x30);
              auVar28._0_4_ = aVar8.x + aVar9.x;
              auVar28._4_4_ = aVar8.y + aVar9.y;
              auVar28._8_4_ = aVar8.z + aVar9.z;
              auVar28._12_4_ = aVar8.field_3.w + aVar9.field_3.w;
              local_1a8 = vminps_avx(local_1a8,(undefined1  [16])aVar8);
              local_198 = vmaxps_avx(local_198,(undefined1  [16])aVar9);
              local_178 = vminps_avx(local_178,auVar28);
              local_188 = vmaxps_avx(local_188,auVar28);
              local_1f0 = local_1f0 + 1;
              prims[local_1b0].lower.field_0.field_1 = aVar8;
              prims[local_1b0].upper.field_0.field_1 = aVar9;
              local_1b0 = local_1b0 + 1;
            }
          }
        }
LAB_01224d83:
        uVar13 = uVar13 + 1;
      } while (uVar13 < r->_end);
    }
    else {
      local_1f0 = 0;
      local_198._8_4_ = 0xff800000;
      local_198._0_8_ = 0xff800000ff800000;
      local_198._12_4_ = 0xff800000;
      local_1a8._8_4_ = 0x7f800000;
      local_1a8._0_8_ = 0x7f8000007f800000;
      local_1a8._12_4_ = 0x7f800000;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_1a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_1a8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_198._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_178._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_178._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_188._8_8_;
    __return_storage_ptr__->end = local_1f0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }